

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int __thiscall
TPZFMatrix<long>::Substitution(TPZFMatrix<long> *this,TPZFMatrix<long> *B,TPZVec<int> *index)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar4;
  long *plVar5;
  char *pcVar6;
  long size;
  long lVar7;
  long lVar8;
  long lVar9;
  TPZVec<long> v;
  long local_80;
  long local_70;
  TPZVec<long> local_68;
  TPZVec<int> *local_48;
  long local_40;
  long local_38;
  
  if (B == (TPZFMatrix<long> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
               ,0x67);
    pcVar6 = "TPZFMatrix<>*B eh nulo";
LAB_00bd570d:
    plVar5 = &std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,0x16);
  }
  else {
    cVar1 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed;
    if (cVar1 != '\x02') {
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                   ,0x67);
        pcVar6 = anon_var_dwarf_35dfcd;
        goto LAB_00bd570d;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                 ,0x67);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nfDecomposed != ELUPivot",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
    }
    lVar7 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    size = (long)(int)lVar7;
    if ((index->fNElements == size) && ((B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow == size)
       ) {
      local_38 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
      if (local_38 < 1) {
        return 1;
      }
      local_40 = (lVar7 << 0x20) + -0x100000000 >> 0x20;
      local_70 = 0;
      local_80 = 0;
      local_48 = index;
      do {
        TPZVec<long>::TPZVec(&local_68,size);
        if (0 < size) {
          lVar7 = 0;
          do {
            lVar9 = (long)index->fStore[lVar7];
            if (((lVar9 < 0) || ((B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow <= lVar9)) ||
               ((B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= local_80)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_68.fStore[lVar7] =
                 B->fElem[(B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * local_80 + lVar9];
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
        }
        if (0 < size) {
          lVar7 = 0;
          do {
            lVar9 = 0;
            if (lVar7 != 0) {
              lVar8 = 0;
              do {
                iVar3 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable[0x21])(this,lVar7,lVar8);
                lVar9 = lVar9 + CONCAT44(extraout_var,iVar3) * local_68.fStore[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar7 != lVar8);
            }
            local_68.fStore[lVar7] = local_68.fStore[lVar7] - lVar9;
            lVar7 = lVar7 + 1;
          } while (lVar7 != size);
        }
        lVar7 = local_40;
        if (-1 < local_40) {
          do {
            lVar8 = 0;
            lVar9 = lVar7;
            while (lVar9 = lVar9 + 1, lVar9 < size) {
              iVar3 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                        _vptr_TPZSavable[0x21])(this,lVar7,lVar9);
              lVar8 = lVar8 + CONCAT44(extraout_var_00,iVar3) * local_68.fStore[lVar9];
            }
            lVar9 = local_68.fStore[lVar7];
            iVar3 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar7,lVar7);
            local_68.fStore[lVar7] = (lVar9 - lVar8) / CONCAT44(extraout_var_01,iVar3);
            bVar2 = 0 < lVar7;
            lVar7 = lVar7 + -1;
          } while (bVar2);
        }
        index = local_48;
        if (0 < size) {
          lVar7 = 0;
          do {
            if (((B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow <= lVar7) ||
               ((B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= local_80)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(long *)((long)B->fElem +
                     lVar7 * 8 + (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * local_70) =
                 local_68.fStore[lVar7];
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
        }
        local_68._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
        if (local_68.fStore != (long *)0x0) {
          operator_delete__(local_68.fStore);
        }
        local_80 = local_80 + 1;
        local_70 = local_70 + 8;
      } while (local_80 != local_38);
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_35dfef,0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"this->fIndex = ",0xf);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  b = ",6);
    plVar5 = (long *)std::ostream::_M_insert<long>((long)poVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B, const TPZVec<int> &index ) const{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    if (!this->fDecomposed){
        PZError <<  __PRETTY_FUNCTION__ << "Matriz não decomposta" << endl;
        return 0;
    }
    
    if (this->fDecomposed != ELUPivot){
        PZError << __PRETTY_FUNCTION__ << "\nfDecomposed != ELUPivot" << endl;
    }
    
    int nRows = this->Rows();
    
    if (index.NElements() != nRows || b.Rows() != nRows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t ncols = B->Cols();
    for(int64_t ic = 0; ic<ncols; ic++)
    {
        int64_t i,j;
        TVar sum = 0;
        
        TPZVec<TVar> v(nRows);
        
        
        for (i=0;i<nRows;i++)
        {
            v[i] = b(index[i],ic);
        }
        
        //Ly=b
        for (i=0;i<nRows;i++)
        {
            sum = 0.;
            for (j=0;j<(i);j++) sum +=this->Get(i,j) * v[j];
            v[i] -= sum;
        }
        
        //Ux=y
        for (i=(nRows-1);i>-1;i--)
        {
            sum = 0.;
            for (j=(i+1);j<nRows;j++) sum += this->Get(i,j) * v[j];
            v[i] = (v[i] - sum) / this->Get(i,i);
        }
        
        for (i=0;i<nRows;i++) b(i,ic) = v[i];
    }
    return 1;
}